

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

Bool CanApplyBlockStyle(Node *node)

{
  Bool BVar1;
  Node *node_local;
  
  BVar1 = prvTidynodeHasCM(node,0xe8);
  if (((((BVar1 == no) ||
        (((node != (Node *)0x0 && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_DIV))))
       || (((node != (Node *)0x0 && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_P))))
      || (((node != (Node *)0x0 && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_TABLE)))
      ) || ((((node != (Node *)0x0 && (node->tag != (Dict *)0x0)) && (node->tag->id == TidyTag_TR))
            || (((node != (Node *)0x0 && (node->tag != (Dict *)0x0)) &&
                (node->tag->id == TidyTag_LI)))))) {
    node_local._4_4_ = no;
  }
  else {
    node_local._4_4_ = yes;
  }
  return node_local._4_4_;
}

Assistant:

static Bool CanApplyBlockStyle( Node *node )
{
    if (TY_(nodeHasCM)(node,CM_BLOCK | CM_LIST | CM_DEFLIST | CM_TABLE)
        && !nodeIsDIV(node) && !nodeIsP(node)
        && !nodeIsTABLE(node) && !nodeIsTR(node) && !nodeIsLI(node) )
    {
        return yes;
    }
    return no;
}